

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2_smpl.c
# Opt level: O0

int ec_GF2m_simple_ladder_pre(EC_GROUP *group,EC_POINT *r,EC_POINT *s,EC_POINT *p,BN_CTX *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  BIGNUM *in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  BIGNUM *in_R8;
  BN_CTX *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char *func;
  BIGNUM *b;
  int local_4;
  
  if (in_RCX[1].neg == 0) {
    local_4 = 0;
  }
  else {
    do {
      b = *(BIGNUM **)(in_RDX + 0x20);
      BN_num_bits((BIGNUM *)in_RDI[8]);
      iVar3 = BN_priv_rand_ex(in_R8,(int)((ulong)b >> 0x20),(int)b,
                              (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                              (uint)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (iVar3 == 0) {
        ERR_new();
        ERR_set_debug((char *)in_R8,(int)((ulong)b >> 0x20),in_stack_ffffffffffffffc0);
        ERR_set_error(0x10,0x80003,(char *)0x0);
        return 0;
      }
      iVar3 = BN_is_zero(*(BIGNUM **)(in_RDX + 0x20));
    } while (iVar3 != 0);
    if (((*(long *)(*in_RDI + 0x118) == 0) ||
        (iVar3 = (**(code **)(*in_RDI + 0x118))
                           (in_RDI,*(undefined8 *)(in_RDX + 0x20),*(undefined8 *)(in_RDX + 0x20),
                            in_R8), iVar3 != 0)) &&
       (uVar1._0_4_ = in_RCX->neg, uVar1._4_4_ = in_RCX->flags,
       iVar3 = (**(code **)(*in_RDI + 0xf8))
                         (in_RDI,*(undefined8 *)(in_RDX + 0x10),uVar1,*(undefined8 *)(in_RDX + 0x20)
                          ,in_R8), iVar3 != 0)) {
      do {
        func = *(char **)(in_RSI + 0x18);
        BN_num_bits((BIGNUM *)in_RDI[8]);
        iVar3 = BN_priv_rand_ex(in_R8,(int)((ulong)b >> 0x20),(int)b,(int)((ulong)func >> 0x20),
                                (uint)func,in_stack_ffffffffffffffb8);
        if (iVar3 == 0) {
          ERR_new();
          ERR_set_debug((char *)in_R8,(int)((ulong)b >> 0x20),func);
          ERR_set_error(0x10,0x80003,(char *)0x0);
          return 0;
        }
        iVar3 = BN_is_zero(*(BIGNUM **)(in_RSI + 0x18));
      } while (iVar3 != 0);
      if (((((*(long *)(*in_RDI + 0x118) == 0) ||
            (iVar3 = (**(code **)(*in_RDI + 0x118))
                               (in_RDI,*(undefined8 *)(in_RSI + 0x18),*(undefined8 *)(in_RSI + 0x18)
                                ,in_R8), iVar3 != 0)) &&
           ((uVar2._0_4_ = in_RCX->neg, uVar2._4_4_ = in_RCX->flags,
            iVar3 = (**(code **)(*in_RDI + 0x100))
                              (in_RDI,*(undefined8 *)(in_RSI + 0x20),uVar2,in_R8), iVar3 != 0 &&
            ((iVar3 = (**(code **)(*in_RDI + 0x100))
                                (in_RDI,*(undefined8 *)(in_RSI + 0x10),
                                 *(undefined8 *)(in_RSI + 0x20),in_R8), iVar3 != 0 &&
             (iVar3 = BN_GF2m_add(in_RCX,in_R8,b), iVar3 != 0)))))) &&
          (iVar3 = (**(code **)(*in_RDI + 0xf8))
                             (in_RDI,*(undefined8 *)(in_RSI + 0x20),*(undefined8 *)(in_RSI + 0x20),
                              *(undefined8 *)(in_RSI + 0x18),in_R8), iVar3 != 0)) &&
         (iVar3 = (**(code **)(*in_RDI + 0xf8))
                            (in_RDI,*(undefined8 *)(in_RSI + 0x10),*(undefined8 *)(in_RSI + 0x10),
                             *(undefined8 *)(in_RSI + 0x18),in_R8), iVar3 != 0)) {
        *(undefined4 *)(in_RDX + 0x28) = 0;
        *(undefined4 *)(in_RSI + 0x28) = 0;
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static
int ec_GF2m_simple_ladder_pre(const EC_GROUP *group,
                              EC_POINT *r, EC_POINT *s,
                              EC_POINT *p, BN_CTX *ctx)
{
    /* if p is not affine, something is wrong */
    if (p->Z_is_one == 0)
        return 0;

    /* s blinding: make sure lambda (s->Z here) is not zero */
    do {
        if (!BN_priv_rand_ex(s->Z, BN_num_bits(group->field) - 1,
                             BN_RAND_TOP_ANY, BN_RAND_BOTTOM_ANY, 0, ctx)) {
            ERR_raise(ERR_LIB_EC, ERR_R_BN_LIB);
            return 0;
        }
    } while (BN_is_zero(s->Z));

    /* if field_encode defined convert between representations */
    if ((group->meth->field_encode != NULL
         && !group->meth->field_encode(group, s->Z, s->Z, ctx))
        || !group->meth->field_mul(group, s->X, p->X, s->Z, ctx))
        return 0;

    /* r blinding: make sure lambda (r->Y here for storage) is not zero */
    do {
        if (!BN_priv_rand_ex(r->Y, BN_num_bits(group->field) - 1,
                             BN_RAND_TOP_ANY, BN_RAND_BOTTOM_ANY, 0, ctx)) {
            ERR_raise(ERR_LIB_EC, ERR_R_BN_LIB);
            return 0;
        }
    } while (BN_is_zero(r->Y));

    if ((group->meth->field_encode != NULL
         && !group->meth->field_encode(group, r->Y, r->Y, ctx))
        || !group->meth->field_sqr(group, r->Z, p->X, ctx)
        || !group->meth->field_sqr(group, r->X, r->Z, ctx)
        || !BN_GF2m_add(r->X, r->X, group->b)
        || !group->meth->field_mul(group, r->Z, r->Z, r->Y, ctx)
        || !group->meth->field_mul(group, r->X, r->X, r->Y, ctx))
        return 0;

    s->Z_is_one = 0;
    r->Z_is_one = 0;

    return 1;
}